

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CustomHeap.cpp
# Opt level: O3

Page * __thiscall
Memory::CustomHeap::Heap<Memory::VirtualAllocWrapper,_Memory::PreReservedVirtualAllocWrapper>::
FindPageToSplit(Heap<Memory::VirtualAllocWrapper,_Memory::PreReservedVirtualAllocWrapper> *this,
               BucketId targetBucket,bool findPreReservedHeapPages)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  long lVar4;
  Page *pPVar5;
  Iterator local_40;
  
  if (targetBucket + Bucket256 < 7) {
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    lVar4 = (long)(targetBucket + Bucket256);
    do {
      local_40.list = this->buckets + lVar4;
      local_40.current = &(local_40.list)->super_DListNodeBase<Memory::CustomHeap::Page>;
      while( true ) {
        if ((DListBase<Memory::CustomHeap::Page,_RealCount> *)local_40.current ==
            (DListBase<Memory::CustomHeap::Page,_RealCount> *)0x0) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          *puVar3 = 1;
          bVar2 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/DList.h"
                             ,0x66,"(current != nullptr)","current != nullptr");
          if (!bVar2) goto LAB_006a1113;
          *puVar3 = 0;
        }
        local_40.current =
             (((DListBase<Memory::CustomHeap::Page,_RealCount> *)local_40.current)->
             super_DListNodeBase<Memory::CustomHeap::Page>).next.base;
        if ((DListBase<Memory::CustomHeap::Page,_RealCount> *)local_40.current == local_40.list)
        break;
        pPVar5 = DListBase<Memory::CustomHeap::Page,_RealCount>::Iterator::Data(&local_40);
        if (pPVar5->inFullList == true) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          *puVar3 = 1;
          bVar2 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/CustomHeap.cpp"
                             ,0x307,"(!pageInBucket.inFullList)","!pageInBucket.inFullList");
          if (!bVar2) {
LAB_006a1113:
            pcVar1 = (code *)invalidInstructionException();
            (*pcVar1)();
          }
          *puVar3 = 0;
        }
        if (findPreReservedHeapPages) {
          bVar2 = CodePageAllocators<Memory::VirtualAllocWrapper,_Memory::PreReservedVirtualAllocWrapper>
                  ::IsPreReservedSegment(this->codePageAllocators,pPVar5->segment);
          if ((bVar2) && (bVar2 = Page::CanAllocate(pPVar5,targetBucket), bVar2)) {
            if (DAT_015bc46a == '\x01') {
              Output::Trace(CustomHeapPhase,
                            L"PRE-RESERVE: Found page for splitting in Pre Reserved Segment\n");
            }
            goto LAB_006a10cb;
          }
        }
        else {
          bVar2 = Page::CanAllocate(pPVar5,targetBucket);
          if (bVar2) {
LAB_006a10cb:
            if (DAT_015bc46a == '\x01') {
              Output::Trace(CustomHeapPhase,L"Found page to split. Moving from bucket %d to %d\n",
                            lVar4);
            }
            pPVar5 = AddPageToBucket(this,pPVar5,targetBucket,false);
            return pPVar5;
          }
        }
      }
      lVar4 = lVar4 + 1;
    } while ((int)lVar4 != 7);
  }
  return (Page *)0x0;
}

Assistant:

Page* Heap<TAlloc, TPreReservedAlloc>::FindPageToSplit(BucketId targetBucket, bool findPreReservedHeapPages)
{
    for (BucketId b = (BucketId)(targetBucket + 1); b < BucketId::NumBuckets; b = (BucketId) (b + 1))
    {
        #pragma prefast(suppress: __WARNING_UNCHECKED_LOWER_BOUND_FOR_ENUMINDEX, "targetBucket is always in range >= SmallObjectList, but an __in_range doesn't fix the warning.");
        FOREACH_DLISTBASE_ENTRY_EDITING(Page, pageInBucket, &this->buckets[b], bucketIter)
        {
            Assert(!pageInBucket.inFullList);
            if (findPreReservedHeapPages && !this->codePageAllocators->IsPreReservedSegment(pageInBucket.segment))
            {
                //Find only pages that are pre-reserved using preReservedHeapPageAllocator
                continue;
            }

            if (pageInBucket.CanAllocate(targetBucket))
            {
                Page* page = &pageInBucket;
                if (findPreReservedHeapPages)
                {
                    VerboseHeapTrace(_u("PRE-RESERVE: Found page for splitting in Pre Reserved Segment\n"));
                }
                VerboseHeapTrace(_u("Found page to split. Moving from bucket %d to %d\n"), b, targetBucket);
                return AddPageToBucket(page, targetBucket);
            }
        }
        NEXT_DLISTBASE_ENTRY_EDITING;
    }

    return nullptr;
}